

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcombobox.cpp
# Opt level: O1

void __thiscall QComboBox::setModelColumn(QComboBox *this,int visibleColumn)

{
  QComboBoxPrivate *this_00;
  int index;
  QListView *this_01;
  QCompleter *pQVar1;
  
  this_00 = *(QComboBoxPrivate **)&(this->super_QWidget).field_0x8;
  this_00->modelColumn = visibleColumn;
  QComboBoxPrivate::viewContainer(this_00);
  this_01 = (QListView *)QMetaObject::cast((QObject *)&QListView::staticMetaObject);
  if (this_01 != (QListView *)0x0) {
    QListView::setModelColumn(this_01,visibleColumn);
  }
  if (this_00->lineEdit != (QLineEdit *)0x0) {
    pQVar1 = QLineEdit::completer(this_00->lineEdit);
    if (pQVar1 != (QCompleter *)0x0) {
      pQVar1 = QLineEdit::completer(this_00->lineEdit);
      QCompleter::setCompletionColumn(pQVar1,visibleColumn);
    }
  }
  index = QPersistentModelIndex::row();
  setCurrentIndex(this,index);
  return;
}

Assistant:

void QComboBox::setModelColumn(int visibleColumn)
{
    Q_D(QComboBox);
    d->modelColumn = visibleColumn;
    QListView *lv = qobject_cast<QListView *>(d->viewContainer()->itemView());
    if (lv)
        lv->setModelColumn(visibleColumn);
#if QT_CONFIG(completer)
    if (d->lineEdit && d->lineEdit->completer())
        d->lineEdit->completer()->setCompletionColumn(visibleColumn);
#endif
    setCurrentIndex(currentIndex()); //update the text to the text of the new column;
}